

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

long * __thiscall google::protobuf::RepeatedField<long>::unsafe_data(RepeatedField<long> *this)

{
  LogMessage *other;
  Rep *pRVar1;
  LogFinisher local_49;
  LogMessage local_48;
  
  pRVar1 = this->rep_;
  if (pRVar1 == (Rep *)0x0) {
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4e2);
    other = internal::LogMessage::operator<<(&local_48,"CHECK failed: rep_: ");
    internal::LogFinisher::operator=(&local_49,other);
    internal::LogMessage::~LogMessage(&local_48);
    pRVar1 = this->rep_;
  }
  return pRVar1->elements;
}

Assistant:

inline const Element* RepeatedField<Element>::unsafe_data() const {
  GOOGLE_DCHECK(rep_);
  return rep_->elements;
}